

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmDbcc<(moira::Instr)42,(moira::Mode)12,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  
  uVar7 = *addr + 2;
  *addr = uVar7;
  iVar5 = (*this->_vptr_Moira[5])(this,(ulong)uVar7);
  pcVar6 = "dbcs";
  if (str->upper != false) {
    pcVar6 = "DBCS";
  }
  cVar1 = *pcVar6;
  while (cVar1 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar1;
    cVar1 = *pcVar6;
  }
  iVar2 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar2) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'D';
  pbVar4 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar4 + 1);
  *pbVar4 = (byte)op & 7 | 0x30;
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  StrWriter::operator<<(str,(UInt)(uVar7 + (int)(short)iVar5));
  return;
}

Assistant:

void
Moira::dasmDbcc(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn ( _____________xxx(op) );
    auto dst = addr + 2;

    dst += (i16)dasmRead<Word>(addr);

    str << Ins<I>{} << tab << src << ", " << UInt(dst);
}